

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall BasicBlock::InsertAfter(BasicBlock *this,Instr *newInstr)

{
  code *pcVar1;
  bool bVar2;
  Instr *pIVar3;
  undefined4 *puVar4;
  Instr *newInstr_local;
  BasicBlock *this_local;
  
  pIVar3 = GetLastInstr(this);
  bVar2 = IR::Instr::HasFallThrough(pIVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xdb2,"(this->GetLastInstr()->HasFallThrough())",
                       "this->GetLastInstr()->HasFallThrough()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pIVar3 = GetLastInstr(this);
  IR::Instr::InsertAfter(pIVar3,newInstr);
  SetLastInstr(this,newInstr);
  return;
}

Assistant:

void
BasicBlock::InsertAfter(IR::Instr *newInstr)
{
    Assert(this->GetLastInstr()->HasFallThrough());
    this->GetLastInstr()->InsertAfter(newInstr);
    this->SetLastInstr(newInstr);
}